

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O1

void __thiscall lunasvg::SVGElement::setAttributes(SVGElement *this,AttributeList *attributes)

{
  _Fwd_list_node_base *p_Var1;
  
  for (p_Var1 = (attributes->
                super__Fwd_list_base<lunasvg::Attribute,_std::allocator<lunasvg::Attribute>_>).
                _M_impl._M_head._M_next; p_Var1 != (_Fwd_list_node_base *)0x0;
      p_Var1 = p_Var1->_M_next) {
    setAttribute(this,*(int *)&p_Var1[1]._M_next,*(PropertyID *)((long)&p_Var1[1]._M_next + 4),
                 (string *)(p_Var1 + 2));
  }
  return;
}

Assistant:

void SVGElement::setAttributes(const AttributeList& attributes)
{
    for(const auto& attribute : attributes) {
        setAttribute(attribute);
    }
}